

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

Value * __thiscall
ot::commissioner::Interpreter::ProcessBbrDatasetJob
          (Value *__return_storage_ptr__,Interpreter *this,CommissionerAppPtr *aCommissioner,
          Expression *aExpr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  ErrorCode EVar3;
  pointer pbVar4;
  element_type *peVar5;
  bool bVar6;
  bool bVar7;
  ulong uVar8;
  Value *pVVar9;
  char *pcVar10;
  char *pcVar11;
  BbrDataset *aDataset;
  string *psVar12;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string *this_00;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  string triHostname;
  Value local_3e8;
  BbrDataset dataset;
  writer write_1;
  writer write;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  Error local_288;
  undefined1 local_260 [40];
  undefined1 local_238 [40];
  undefined1 local_210 [40];
  Error local_1e8;
  undefined1 local_1c0 [40];
  Error local_198;
  undefined1 local_170 [40];
  Error local_148;
  undefined1 local_120 [40];
  undefined1 local_f8 [40];
  undefined1 local_d0 [40];
  Error local_a8;
  Error local_80;
  Error local_58;
  
  (__return_storage_ptr__->mError).mCode = kNone;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mError).mMessage.field_2;
  (__return_storage_ptr__->mError).mMessage._M_string_length = 0;
  (__return_storage_ptr__->mError).mMessage.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->mData)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  pbVar4 = (aExpr->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(aExpr->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4) < 0x21) {
    local_3e8.mError._0_8_ = local_3e8.mError._0_8_ & 0xffffffff00000000;
    local_3e8.mError.mMessage._M_dataplus._M_p = "too few arguments";
    local_3e8.mError.mMessage._M_string_length = 0x11;
    local_3e8.mError.mMessage.field_2._M_allocated_capacity = 0;
    local_3e8.mData._M_dataplus._M_p = (pointer)0x0;
    pcVar10 = "too few arguments";
    local_3e8.mError.mMessage.field_2._8_8_ = (format_string_checker<char> *)&local_3e8;
    while (pcVar11 = pcVar10, pcVar11 != "") {
      pcVar10 = pcVar11 + 1;
      if (*pcVar11 == '}') {
        if ((pcVar10 == "") || (*pcVar10 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar10 = pcVar11 + 2;
      }
      else if (*pcVar11 == '{') {
        pcVar10 = ::fmt::v10::detail::
                  parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                            (pcVar11,"",(format_string_checker<char> *)&local_3e8);
      }
    }
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_3e8;
    ::fmt::v10::vformat_abi_cxx11_
              (&triHostname,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args);
    psVar12 = &local_58.mMessage;
    local_58.mCode = kInvalidArgs;
    std::__cxx11::string::string((string *)psVar12,(string *)&triHostname);
    Value::Value((Value *)&dataset,&local_58);
LAB_00124479:
    Value::operator=(__return_storage_ptr__,(Value *)&dataset);
    Value::~Value((Value *)&dataset);
  }
  else {
    std::__cxx11::string::string((string *)&dataset,"get",(allocator *)&local_3e8);
    bVar6 = CaseInsensitiveEqual(pbVar4 + 1,&dataset.mTriHostname);
    std::__cxx11::string::~string((string *)&dataset);
    if (!bVar6) {
      pbVar4 = (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::string::string((string *)&dataset,"set",(allocator *)&local_3e8);
      bVar7 = CaseInsensitiveEqual(pbVar4 + 1,&dataset.mTriHostname);
      std::__cxx11::string::~string((string *)&dataset);
      if (!bVar7) {
        local_3e8.mError.mCode = string_type;
        local_3e8.mError.mMessage._M_dataplus._M_p = "\'{}\' is not a valid sub-command";
        local_3e8.mError.mMessage._M_string_length = 0x1f;
        local_3e8.mError.mMessage.field_2._M_allocated_capacity = 0x100000000;
        local_3e8.mData._M_dataplus._M_p =
             (pointer)::fmt::v10::detail::
                      parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
        ;
        pcVar10 = "\'{}\' is not a valid sub-command";
        local_3e8.mError.mMessage.field_2._8_8_ = (format_string_checker<char> *)&local_3e8;
        while (pcVar11 = pcVar10, pcVar11 != "") {
          pcVar10 = pcVar11 + 1;
          if (*pcVar11 == '}') {
            if ((pcVar10 == "") || (*pcVar10 != '}')) {
              ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
            }
            pcVar10 = pcVar11 + 2;
          }
          else if (*pcVar11 == '{') {
            pcVar10 = ::fmt::v10::detail::
                      parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                                (pcVar11,"",(format_string_checker<char> *)&local_3e8);
          }
        }
        pbVar4 = (aExpr->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_3e8.mError._0_8_ = pbVar4[1]._M_dataplus._M_p;
        local_3e8.mError.mMessage._M_dataplus._M_p = (pointer)pbVar4[1]._M_string_length;
        fmt.size_ = 0xd;
        fmt.data_ = (char *)0x1f;
        args_00.field_1.values_ = in_R9.values_;
        args_00.desc_ = (unsigned_long_long)&local_3e8;
        ::fmt::v10::vformat_abi_cxx11_
                  (&triHostname,(v10 *)"\'{}\' is not a valid sub-command",fmt,args_00);
        psVar12 = &local_80.mMessage;
        local_80.mCode = kInvalidCommand;
        std::__cxx11::string::string((string *)psVar12,(string *)&triHostname);
        Value::Value((Value *)&dataset,&local_80);
        goto LAB_00124479;
      }
    }
    pbVar4 = (aExpr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar8 = (long)(aExpr->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4;
    if (bVar6 && uVar8 == 0x40) {
      dataset.mTriHostname._M_dataplus._M_p = (pointer)&dataset.mTriHostname.field_2;
      dataset.mTriHostname._M_string_length = 0;
      dataset.mTriHostname.field_2._M_local_buf[0] = '\0';
      dataset.mRegistrarHostname._M_dataplus._M_p = (pointer)&dataset.mRegistrarHostname.field_2;
      dataset.mRegistrarHostname._M_string_length = 0;
      dataset.mRegistrarHostname.field_2._M_local_buf[0] = '\0';
      dataset.mRegistrarIpv6Addr._M_dataplus._M_p = (pointer)&dataset.mRegistrarIpv6Addr.field_2;
      dataset.mRegistrarIpv6Addr._M_string_length = 0;
      dataset.mRegistrarIpv6Addr.field_2._M_local_buf[0] = '\0';
      dataset.mPresentFlags = 0;
      peVar5 = (aCommissioner->
               super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      (*(peVar5->super_CommissionerHandler)._vptr_CommissionerHandler[0x3c])
                (local_170,peVar5,&dataset,0xffff);
      Value::Value(&local_3e8,(Error *)local_170);
      pVVar9 = Value::operator=(__return_storage_ptr__,&local_3e8);
      EVar3 = (pVVar9->mError).mCode;
      Value::~Value(&local_3e8);
      std::__cxx11::string::~string((string *)(local_170 + 8));
      if (EVar3 != kNone) goto LAB_001243a9;
      BbrDatasetToJson_abi_cxx11_(&local_2a8,(commissioner *)&dataset,aDataset);
      Value::Value(&local_3e8,&local_2a8);
      Value::operator=(__return_storage_ptr__,&local_3e8);
      Value::~Value(&local_3e8);
      psVar12 = &local_2a8;
LAB_001243a4:
      std::__cxx11::string::~string((string *)psVar12);
LAB_001243a9:
      BbrDataset::~BbrDataset(&dataset);
      return __return_storage_ptr__;
    }
    if (uVar8 < 0x41) {
      local_3e8.mError._0_8_ = local_3e8.mError._0_8_ & 0xffffffff00000000;
      local_3e8.mError.mMessage._M_dataplus._M_p = "too few arguments";
      local_3e8.mError.mMessage._M_string_length = 0x11;
      local_3e8.mError.mMessage.field_2._M_allocated_capacity = 0;
      local_3e8.mData._M_dataplus._M_p = (pointer)0x0;
      pcVar10 = "too few arguments";
      local_3e8.mError.mMessage.field_2._8_8_ = (format_string_checker<char> *)&local_3e8;
      while (pcVar11 = pcVar10, pcVar11 != "") {
        pcVar10 = pcVar11 + 1;
        if (*pcVar11 == '}') {
          if ((pcVar10 == "") || (*pcVar10 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar10 = pcVar11 + 2;
        }
        else if (*pcVar11 == '{') {
          pcVar10 = ::fmt::v10::detail::
                    parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                              (pcVar11,"",(format_string_checker<char> *)&local_3e8);
        }
      }
      args_01.field_1.args_ = in_R9.args_;
      args_01.desc_ = (unsigned_long_long)&local_3e8;
      ::fmt::v10::vformat_abi_cxx11_
                (&triHostname,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args_01);
      psVar12 = &local_a8.mMessage;
      local_a8.mCode = kInvalidArgs;
      std::__cxx11::string::string((string *)psVar12,(string *)&triHostname);
      Value::Value((Value *)&dataset,&local_a8);
      goto LAB_00124479;
    }
    std::__cxx11::string::string((string *)&dataset,"trihostname",(allocator *)&local_3e8);
    bVar7 = CaseInsensitiveEqual(pbVar4 + 2,&dataset.mTriHostname);
    std::__cxx11::string::~string((string *)&dataset);
    paVar1 = &triHostname.field_2;
    if (bVar7) {
      triHostname._M_string_length = 0;
      triHostname.field_2._M_local_buf[0] = '\0';
      if (bVar6) {
        peVar5 = (aCommissioner->
                 super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        triHostname._M_dataplus._M_p = (pointer)paVar1;
        (*(peVar5->super_CommissionerHandler)._vptr_CommissionerHandler[0x37])
                  (local_1c0,peVar5,&triHostname);
        Value::Value((Value *)&dataset,(Error *)local_1c0);
        pVVar9 = Value::operator=(__return_storage_ptr__,(Value *)&dataset);
        EVar3 = (pVVar9->mError).mCode;
        Value::~Value((Value *)&dataset);
        std::__cxx11::string::~string((string *)(local_1c0 + 8));
        if (EVar3 != kNone) goto LAB_0012449c;
        std::__cxx11::string::string((string *)&local_2c8,(string *)&triHostname);
        Value::Value((Value *)&dataset,&local_2c8);
        Value::operator=(__return_storage_ptr__,(Value *)&dataset);
        Value::~Value((Value *)&dataset);
        psVar12 = &local_2c8;
      }
      else {
        pbVar4 = (aExpr->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(aExpr->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4) < 0x61) {
          local_3e8.mError._0_8_ = local_3e8.mError._0_8_ & 0xffffffff00000000;
          local_3e8.mError.mMessage._M_dataplus._M_p = "too few arguments";
          local_3e8.mError.mMessage._M_string_length = 0x11;
          local_3e8.mError.mMessage.field_2._M_allocated_capacity = 0;
          local_3e8.mData._M_dataplus._M_p = (pointer)0x0;
          pcVar10 = "too few arguments";
          triHostname._M_dataplus._M_p = (pointer)paVar1;
          local_3e8.mError.mMessage.field_2._8_8_ = (format_string_checker<char> *)&local_3e8;
          while (pcVar11 = pcVar10, pcVar11 != "") {
            pcVar10 = pcVar11 + 1;
            if (*pcVar11 == '}') {
              if ((pcVar10 == "") || (*pcVar10 != '}')) {
                ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
              }
              pcVar10 = pcVar11 + 2;
            }
            else if (*pcVar11 == '{') {
              pcVar10 = ::fmt::v10::detail::
                        parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                                  (pcVar11,"",(format_string_checker<char> *)&local_3e8);
            }
          }
          args_02.field_1.args_ = in_R9.args_;
          args_02.desc_ = (unsigned_long_long)&local_3e8;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)&write_1,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),
                     args_02);
          this_00 = (string *)(local_d0 + 8);
          local_d0._0_4_ = kInvalidArgs;
          std::__cxx11::string::string(this_00,(string *)&write_1);
          Value::Value((Value *)&dataset,(Error *)local_d0);
          goto LAB_00124f34;
        }
        peVar5 = (aCommissioner->
                 super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        triHostname._M_dataplus._M_p = (pointer)paVar1;
        (*(peVar5->super_CommissionerHandler)._vptr_CommissionerHandler[0x38])
                  (&local_198,peVar5,pbVar4 + 3);
        Value::Value((Value *)&dataset,&local_198);
        Value::operator=(__return_storage_ptr__,(Value *)&dataset);
        Value::~Value((Value *)&dataset);
        psVar12 = &local_198.mMessage;
      }
    }
    else {
      pbVar4 = (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::string::string((string *)&dataset,"reghostname",(allocator *)&local_3e8);
      bVar7 = CaseInsensitiveEqual(pbVar4 + 2,&dataset.mTriHostname);
      std::__cxx11::string::~string((string *)&dataset);
      if (bVar7) {
        triHostname._M_string_length = 0;
        triHostname.field_2._M_local_buf[0] = '\0';
        if (bVar6) {
          peVar5 = (aCommissioner->
                   super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
          triHostname._M_dataplus._M_p = (pointer)paVar1;
          (*(peVar5->super_CommissionerHandler)._vptr_CommissionerHandler[0x39])
                    (local_210,peVar5,&triHostname);
          Value::Value((Value *)&dataset,(Error *)local_210);
          pVVar9 = Value::operator=(__return_storage_ptr__,(Value *)&dataset);
          EVar3 = (pVVar9->mError).mCode;
          Value::~Value((Value *)&dataset);
          std::__cxx11::string::~string((string *)(local_210 + 8));
          if (EVar3 != kNone) goto LAB_0012449c;
          std::__cxx11::string::string((string *)&local_2e8,(string *)&triHostname);
          Value::Value((Value *)&dataset,&local_2e8);
          Value::operator=(__return_storage_ptr__,(Value *)&dataset);
          Value::~Value((Value *)&dataset);
          psVar12 = &local_2e8;
        }
        else {
          pbVar4 = (aExpr->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if ((ulong)((long)(aExpr->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4) < 0x61) {
            local_3e8.mError._0_8_ = local_3e8.mError._0_8_ & 0xffffffff00000000;
            local_3e8.mError.mMessage._M_dataplus._M_p = "too few arguments";
            local_3e8.mError.mMessage._M_string_length = 0x11;
            local_3e8.mError.mMessage.field_2._M_allocated_capacity = 0;
            local_3e8.mData._M_dataplus._M_p = (pointer)0x0;
            pcVar10 = "too few arguments";
            triHostname._M_dataplus._M_p = (pointer)paVar1;
            local_3e8.mError.mMessage.field_2._8_8_ = (format_string_checker<char> *)&local_3e8;
            while (pcVar11 = pcVar10, pcVar11 != "") {
              pcVar10 = pcVar11 + 1;
              if (*pcVar11 == '}') {
                if ((pcVar10 == "") || (*pcVar10 != '}')) {
                  ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
                }
                pcVar10 = pcVar11 + 2;
              }
              else if (*pcVar11 == '{') {
                pcVar10 = ::fmt::v10::detail::
                          parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                                    (pcVar11,"",(format_string_checker<char> *)&local_3e8);
              }
            }
            args_03.field_1.args_ = in_R9.args_;
            args_03.desc_ = (unsigned_long_long)&local_3e8;
            ::fmt::v10::vformat_abi_cxx11_
                      ((string *)&write_1,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),
                       args_03);
            this_00 = (string *)(local_f8 + 8);
            local_f8._0_4_ = kInvalidArgs;
            std::__cxx11::string::string(this_00,(string *)&write_1);
            Value::Value((Value *)&dataset,(Error *)local_f8);
            goto LAB_00124f34;
          }
          peVar5 = (aCommissioner->
                   super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
          triHostname._M_dataplus._M_p = (pointer)paVar1;
          (*(peVar5->super_CommissionerHandler)._vptr_CommissionerHandler[0x3a])
                    (&local_1e8,peVar5,pbVar4 + 3);
          Value::Value((Value *)&dataset,&local_1e8);
          Value::operator=(__return_storage_ptr__,(Value *)&dataset);
          Value::~Value((Value *)&dataset);
          psVar12 = &local_1e8.mMessage;
        }
      }
      else {
        pbVar4 = (aExpr->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        std::__cxx11::string::string((string *)&dataset,"regaddr",(allocator *)&local_3e8);
        bVar7 = CaseInsensitiveEqual(pbVar4 + 2,&dataset.mTriHostname);
        std::__cxx11::string::~string((string *)&dataset);
        if (!bVar7) {
          if (!bVar6) {
            dataset.mTriHostname._M_dataplus._M_p = (pointer)&dataset.mTriHostname.field_2;
            dataset.mTriHostname._M_string_length = 0;
            dataset.mTriHostname.field_2._M_local_buf[0] = '\0';
            dataset.mRegistrarHostname._M_dataplus._M_p =
                 (pointer)&dataset.mRegistrarHostname.field_2;
            dataset.mRegistrarHostname._M_string_length = 0;
            dataset.mRegistrarHostname.field_2._M_local_buf[0] = '\0';
            dataset.mRegistrarIpv6Addr._M_dataplus._M_p =
                 (pointer)&dataset.mRegistrarIpv6Addr.field_2;
            dataset.mRegistrarIpv6Addr._M_string_length = 0;
            dataset.mRegistrarIpv6Addr.field_2._M_local_buf[0] = '\0';
            dataset.mPresentFlags = 0;
            BbrDatasetFromJson((Error *)local_260,&dataset,
                               (aExpr->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start + 2);
            Value::Value(&local_3e8,(Error *)local_260);
            pVVar9 = Value::operator=(__return_storage_ptr__,&local_3e8);
            EVar3 = (pVVar9->mError).mCode;
            Value::~Value(&local_3e8);
            std::__cxx11::string::~string((string *)(local_260 + 8));
            if (EVar3 != kNone) goto LAB_001243a9;
            peVar5 = (aCommissioner->
                     super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr;
            (*(peVar5->super_CommissionerHandler)._vptr_CommissionerHandler[0x3d])
                      (&local_288,peVar5,&dataset);
            Value::Value(&local_3e8,&local_288);
            Value::operator=(__return_storage_ptr__,&local_3e8);
            Value::~Value(&local_3e8);
            psVar12 = &local_288.mMessage;
            goto LAB_001243a4;
          }
          local_3e8.mError.mCode = string_type;
          local_3e8.mError.mMessage._M_dataplus._M_p = "{} is not a valid BBR Dataset field";
          local_3e8.mError.mMessage._M_string_length = 0x23;
          local_3e8.mError.mMessage.field_2._M_allocated_capacity = 0x100000000;
          local_3e8.mData._M_dataplus._M_p =
               (pointer)::fmt::v10::detail::
                        parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
          ;
          pcVar10 = "{} is not a valid BBR Dataset field";
          local_3e8.mError.mMessage.field_2._8_8_ = (format_string_checker<char> *)&local_3e8;
          write_1.handler_ = (format_string_checker<char> *)&local_3e8;
          while (pcVar10 != "") {
            cVar2 = *pcVar10;
            pcVar11 = pcVar10;
            while (cVar2 != '{') {
              pcVar11 = pcVar11 + 1;
              if (pcVar11 == "") {
                ::fmt::v10::detail::
                parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::writer::operator()(&write_1,pcVar10,"");
                goto LAB_00124e6c;
              }
              cVar2 = *pcVar11;
            }
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::writer::operator()(&write_1,pcVar10,pcVar11);
            pcVar10 = ::fmt::v10::detail::
                      parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                                (pcVar11,"",(format_string_checker<char> *)&local_3e8);
          }
LAB_00124e6c:
          pbVar4 = (aExpr->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          local_3e8.mError._0_8_ = pbVar4[2]._M_dataplus._M_p;
          local_3e8.mError.mMessage._M_dataplus._M_p = (pointer)pbVar4[2]._M_string_length;
          fmt_00.size_ = 0xd;
          fmt_00.data_ = (char *)0x23;
          args_04.field_1.values_ = in_R9.values_;
          args_04.desc_ = (unsigned_long_long)&local_3e8;
          ::fmt::v10::vformat_abi_cxx11_
                    (&triHostname,(v10 *)"{} is not a valid BBR Dataset field",fmt_00,args_04);
          psVar12 = &local_148.mMessage;
          local_148.mCode = kInvalidArgs;
          std::__cxx11::string::string((string *)psVar12,(string *)&triHostname);
          Value::Value((Value *)&dataset,&local_148);
          goto LAB_00124479;
        }
        triHostname._M_string_length = 0;
        triHostname.field_2._M_local_buf[0] = '\0';
        if (bVar6) {
          peVar5 = (aCommissioner->
                   super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
          triHostname._M_dataplus._M_p = (pointer)paVar1;
          (*(peVar5->super_CommissionerHandler)._vptr_CommissionerHandler[0x3b])
                    (local_238,peVar5,&triHostname);
          Value::Value((Value *)&dataset,(Error *)local_238);
          pVVar9 = Value::operator=(__return_storage_ptr__,(Value *)&dataset);
          EVar3 = (pVVar9->mError).mCode;
          Value::~Value((Value *)&dataset);
          std::__cxx11::string::~string((string *)(local_238 + 8));
          if (EVar3 != kNone) goto LAB_0012449c;
          std::__cxx11::string::string((string *)&local_308,(string *)&triHostname);
          Value::Value((Value *)&dataset,&local_308);
          Value::operator=(__return_storage_ptr__,(Value *)&dataset);
          Value::~Value((Value *)&dataset);
          psVar12 = &local_308;
        }
        else {
          local_3e8.mError._0_8_ = (ulong)(uint)local_3e8.mError._4_4_ << 0x20;
          local_3e8.mError.mMessage._M_dataplus._M_p = "cannot set  read-only Registrar Address";
          local_3e8.mError.mMessage._M_string_length = 0x27;
          local_3e8.mError.mMessage.field_2._M_allocated_capacity = 0;
          local_3e8.mData._M_dataplus._M_p = (pointer)0x0;
          pcVar10 = "cannot set  read-only Registrar Address";
          triHostname._M_dataplus._M_p = (pointer)paVar1;
          local_3e8.mError.mMessage.field_2._8_8_ = (format_string_checker<char> *)&local_3e8;
          write.handler_ = (format_string_checker<char> *)&local_3e8;
          while (pcVar10 != "") {
            cVar2 = *pcVar10;
            pcVar11 = pcVar10;
            while (cVar2 != '{') {
              pcVar11 = pcVar11 + 1;
              if (pcVar11 == "") {
                ::fmt::v10::detail::
                parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::
                writer::operator()(&write,pcVar10,"");
                goto LAB_00124ee1;
              }
              cVar2 = *pcVar11;
            }
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer
            ::operator()(&write,pcVar10,pcVar11);
            pcVar10 = ::fmt::v10::detail::
                      parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                                (pcVar11,"",(format_string_checker<char> *)&local_3e8);
          }
LAB_00124ee1:
          args_05.field_1.args_ = in_R9.args_;
          args_05.desc_ = (unsigned_long_long)&local_3e8;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)&write_1,(v10 *)"cannot set  read-only Registrar Address",
                     (string_view)ZEXT816(0x27),args_05);
          this_00 = (string *)(local_120 + 8);
          local_120._0_4_ = kInvalidArgs;
          std::__cxx11::string::string(this_00,(string *)&write_1);
          Value::Value((Value *)&dataset,(Error *)local_120);
LAB_00124f34:
          Value::operator=(__return_storage_ptr__,(Value *)&dataset);
          Value::~Value((Value *)&dataset);
          std::__cxx11::string::~string(this_00);
          psVar12 = (string *)&write_1;
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)psVar12);
LAB_0012449c:
  std::__cxx11::string::~string((string *)&triHostname);
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessBbrDatasetJob(CommissionerAppPtr &aCommissioner, const Expression &aExpr)
{
    Value value;
    bool  isSet;

    VerifyOrExit(aExpr.size() >= 2, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
    if (CaseInsensitiveEqual(aExpr[1], "get"))
    {
        isSet = false;
    }
    else if (CaseInsensitiveEqual(aExpr[1], "set"))
    {
        isSet = true;
    }
    else
    {
        ExitNow(value = ERROR_INVALID_COMMAND(SYNTAX_INVALID_SUBCOMMAND, aExpr[1]));
    }

    if (aExpr.size() == 2 && !isSet)
    {
        BbrDataset dataset;
        SuccessOrExit(value = aCommissioner->GetBbrDataset(dataset, 0xFFFF));
        ExitNow(value = BbrDatasetToJson(dataset));
    }

    VerifyOrExit(aExpr.size() >= 3, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));

    if (CaseInsensitiveEqual(aExpr[2], "trihostname"))
    {
        std::string triHostname;
        if (isSet)
        {
            VerifyOrExit(aExpr.size() >= 4, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
            SuccessOrExit(value = aCommissioner->SetTriHostname(aExpr[3]));
        }
        else
        {
            SuccessOrExit(value = aCommissioner->GetTriHostname(triHostname));
            value = triHostname;
        }
    }
    else if (CaseInsensitiveEqual(aExpr[2], "reghostname"))
    {
        std::string regHostname;
        if (isSet)
        {
            VerifyOrExit(aExpr.size() >= 4, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
            SuccessOrExit(value = aCommissioner->SetRegistrarHostname(aExpr[3]));
        }
        else
        {
            SuccessOrExit(value = aCommissioner->GetRegistrarHostname(regHostname));
            value = regHostname;
        }
    }
    else if (CaseInsensitiveEqual(aExpr[2], "regaddr"))
    {
        std::string regAddr;
        VerifyOrExit(!isSet, value = ERROR_INVALID_ARGS("cannot set  read-only Registrar Address"));
        SuccessOrExit(value = aCommissioner->GetRegistrarIpv6Addr(regAddr));
        value = regAddr;
    }
    else
    {
        if (isSet)
        {
            BbrDataset dataset;
            SuccessOrExit(value = BbrDatasetFromJson(dataset, aExpr[2]));
            SuccessOrExit(value = aCommissioner->SetBbrDataset(dataset));
        }
        else
        {
            value = ERROR_INVALID_ARGS("{} is not a valid BBR Dataset field", aExpr[2]);
        }
    }

exit:
    return value;
}